

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

boolean detonate_obj(obj *otmp,obj *ostack,obj *olaunch,int x,int y,boolean thrown)

{
  char cVar1;
  byte bVar2;
  boolean bVar3;
  int dam;
  char *pcVar4;
  schar sVar5;
  bool bVar6;
  
  cVar1 = otmp->oartifact;
  bVar3 = obj_resists(otmp,0,100);
  if (bVar3 != '\0' && cVar1 == '\0') {
    return '\0';
  }
  bVar3 = oprop_attack(0x20000,otmp,olaunch,thrown);
  if (bVar3 == '\0') {
    if ((otmp->oprops & 0x20000) != 0) {
      bVar2 = otmp->oclass;
      if ((bVar2 == 2) || (bVar2 == 0xd)) {
        sVar5 = objects[otmp->otyp].oc_subtyp;
        if ((byte)(sVar5 + 0x18U) < 3) goto LAB_00149bca;
        if ((bVar2 | 4) == 6) goto LAB_00149ccd;
      }
      else if (bVar2 == 6) {
        sVar5 = objects[otmp->otyp].oc_subtyp;
LAB_00149ccd:
        if ((byte)(sVar5 + 0x1bU) < 3) goto LAB_00149bca;
      }
    }
    bVar6 = false;
  }
  else {
LAB_00149bca:
    pcVar4 = xname(otmp);
    pline("The %s explodes!",pcVar4);
    oprop_id(0x20000,otmp,ostack,olaunch);
    if (cVar1 == '\0') {
      thrownobj = (obj *)0x0;
      obfree(otmp,(obj *)0x0);
    }
    bVar6 = cVar1 == '\0';
    dam = dice(4,4);
    explode(x,y,0xb,dam,'\x02',5);
    scatter(x,y,dam,0x1f,(obj *)0x0);
  }
  return bVar6;
}

Assistant:

boolean detonate_obj(struct obj *otmp, struct obj *ostack, struct obj *olaunch,
		     int x, int y, boolean thrown)
{
	boolean is_artifact;
	int dmg;

	/* Don't destroy vital objects, but allow artifacts,
	 * e.g. the Heart of Ahriman fired from a sling of detonation . */
	is_artifact = !!otmp->oartifact;
	if (obj_resists(otmp, 0, 100) && !is_artifact)
	    return FALSE;

	if (!oprop_attack(ITEM_DETONATIONS, otmp, olaunch, thrown) &&
	    /* ammo and missiles may detonate even if dropped */
	    !((otmp->oprops & ITEM_DETONATIONS) &&
	      (is_ammo(otmp) || is_missile(otmp))))
	    return FALSE;

	pline("The %s explodes!", xname(otmp));
	oprop_id(ITEM_DETONATIONS, otmp, ostack, olaunch);

	if (!is_artifact) {
	    thrownobj = NULL;
	    obfree(otmp, NULL);
	    otmp = NULL;
	}

	/* otmp->ox and otmp->oy may not be set correctly, or even at all! */
	dmg = dice(4, 4);
	explode(x, y, ZT_SPELL(ZT_FIRE), dmg, WEAPON_CLASS, EXPL_FIERY);
	scatter(x, y, dmg, VIS_EFFECTS|MAY_HIT|MAY_DESTROY|MAY_FRACTURE, NULL);

	return !is_artifact;
}